

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O2

TCGReg tcg_reg_alloc(TCGContext_conflict9 *s,TCGRegSet required_regs,TCGRegSet allocated_regs,
                    TCGRegSet preferred_regs,_Bool rev)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  ulong uVar4;
  TCGReg TVar5;
  ulong uVar6;
  ulong uVar7;
  undefined7 in_register_00000081;
  ulong uVar8;
  long lVar9;
  TCGRegSet reg_ct [2];
  
  reg_ct[1] = ~allocated_regs & required_regs;
  reg_ct[0] = preferred_regs & reg_ct[1];
  if ((int)CONCAT71(in_register_00000081,rev) == 0) {
    piVar3 = tcg_target_reg_alloc_order;
  }
  else {
    piVar3 = s->indirect_reg_alloc_order;
  }
  uVar4 = (ulong)(reg_ct[0] == 0 || reg_ct[0] == reg_ct[1]);
  uVar7 = (uVar4 - (reg_ct[0] == reg_ct[1] || reg_ct[0] == 0)) + 2;
  for (uVar8 = uVar4; uVar8 != uVar7; uVar8 = uVar8 + 1) {
    uVar1 = reg_ct[uVar8];
    if ((uVar1 & uVar1 - 1) == 0) {
      uVar6 = 0x20;
      if (uVar1 != 0) {
        uVar2 = 0;
        if (uVar1 != 0) {
          for (; (uVar1 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        uVar6 = (ulong)uVar2;
      }
      if (s->reg_to_temp[uVar6] == (TCGTemp *)0x0) {
        return (TCGReg)uVar6;
      }
    }
    else {
      for (lVar9 = 0; lVar9 != 0x1f; lVar9 = lVar9 + 1) {
        TVar5 = piVar3[lVar9];
        if ((s->reg_to_temp[TVar5] == (TCGTemp *)0x0) &&
           ((uVar1 >> (TVar5 & TCG_REG_XMM15) & 1) != 0)) {
          return TVar5;
        }
      }
    }
  }
  while( true ) {
    if (uVar4 == uVar7) {
      fprintf(_stderr,"%s:%d: tcg fatal error\n",
              "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
              ,0xbe8);
      abort();
    }
    uVar1 = reg_ct[uVar4];
    if ((uVar1 & uVar1 - 1) == 0) break;
    lVar9 = 0;
    while (lVar9 != 0x1f) {
      TVar5 = piVar3[lVar9];
      lVar9 = lVar9 + 1;
      if ((uVar1 >> (TVar5 & TCG_REG_XMM15) & 1) != 0) goto LAB_00b26f54;
    }
    uVar4 = uVar4 + 1;
  }
  if (uVar1 == 0) {
    TVar5 = 0x20;
  }
  else {
    TVar5 = TCG_REG_EAX;
    if (uVar1 != 0) {
      for (; (uVar1 >> TVar5 & 1) == 0; TVar5 = TVar5 + TCG_REG_ECX) {
      }
    }
  }
LAB_00b26f54:
  tcg_reg_free(s,TVar5,allocated_regs);
  return TVar5;
}

Assistant:

static TCGReg tcg_reg_alloc(TCGContext *s, TCGRegSet required_regs,
                            TCGRegSet allocated_regs,
                            TCGRegSet preferred_regs, bool rev)
{
    int i, j, f, n = ARRAY_SIZE(tcg_target_reg_alloc_order);
    TCGRegSet reg_ct[2];
    const int *order;

    reg_ct[1] = required_regs & ~allocated_regs;
    tcg_debug_assert(reg_ct[1] != 0);
    reg_ct[0] = reg_ct[1] & preferred_regs;

    /* Skip the preferred_regs option if it cannot be satisfied,
       or if the preference made no difference.  */
    f = reg_ct[0] == 0 || reg_ct[0] == reg_ct[1];

    order = rev ? s->indirect_reg_alloc_order : tcg_target_reg_alloc_order;

    /* Try free registers, preferences first.  */
    for (j = f; j < 2; j++) {
        TCGRegSet set = reg_ct[j];

        if (tcg_regset_single(set)) {
            /* One register in the set.  */
            TCGReg reg = tcg_regset_first(set);
            if (s->reg_to_temp[reg] == NULL) {
                return reg;
            }
        } else {
            for (i = 0; i < n; i++) {
                TCGReg reg = order[i];
                if (s->reg_to_temp[reg] == NULL &&
                    tcg_regset_test_reg(set, reg)) {
                    return reg;
                }
            }
        }
    }

    /* We must spill something.  */
    for (j = f; j < 2; j++) {
        TCGRegSet set = reg_ct[j];

        if (tcg_regset_single(set)) {
            /* One register in the set.  */
            TCGReg reg = tcg_regset_first(set);
            tcg_reg_free(s, reg, allocated_regs);
            return reg;
        } else {
            for (i = 0; i < n; i++) {
                TCGReg reg = order[i];
                if (tcg_regset_test_reg(set, reg)) {
                    tcg_reg_free(s, reg, allocated_regs);
                    return reg;
                }
            }
        }
    }

    tcg_abort();
}